

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::abort(torrent *this)

{
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  alert_manager *paVar4;
  info_hash_t *args_1;
  value_type *pvVar5;
  undefined4 extraout_var_02;
  client_data_t cVar6;
  strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void> local_f8;
  strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void> local_f4;
  undefined1 auStack_f0 [4];
  torrent_list_index_t i;
  undefined1 local_e0 [16];
  undefined1 local_d0 [40];
  exception *e;
  code *local_98;
  pointer local_90;
  type local_88;
  function<void_()> local_68;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_48;
  error_code local_38;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_24;
  uint local_20;
  uint local_1c;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_18;
  strong_typedef<int,_libtorrent::queue_position_tag,_void> local_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  torrent *this_local;
  
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffffbffffff | 0x4000000;
    local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    update_want_peers(this);
    update_want_tick(this);
    update_want_scrape(this);
    update_gauge(this);
    stop_announcing(this);
    psVar1 = (this->super_torrent_hot_members).m_ses;
    strong_typedef<int,_libtorrent::queue_position_tag,_void>::strong_typedef(&local_14,-1);
    (*(psVar1->super_session_logger)._vptr_session_logger[0x1b])
              (psVar1,this,(ulong)(uint)local_14.m_val);
    strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef(&local_18,0);
    bVar2 = strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::operator>
                      (&this->m_peer_class,&local_18);
    if (bVar2) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      local_1c = (this->m_peer_class).m_val;
      peer_class_set::remove_class
                (&this->super_peer_class_set,(peer_class_pool *)CONCAT44(extraout_var,iVar3),
                 (peer_class_t)local_1c);
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      local_20 = (this->m_peer_class).m_val;
      peer_class_pool::decref
                ((peer_class_pool *)CONCAT44(extraout_var_00,iVar3),(peer_class_t)local_20);
      strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef(&local_24,0);
      (this->m_peer_class).m_val = local_24.m_val;
    }
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_inactivity_timer);
    log_to_all_peers(this,"aborting");
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_38,torrent_aborted,(type *)0x0);
    disconnect_all(this,&local_38,bittorrent);
    on_remove_peers(this);
    bVar2 = storage_holder::operator_cast_to_bool(&this->m_storage);
    if (bVar2) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      local_48.m_val = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
      local_98 = on_torrent_aborted;
      local_90 = (pointer)0x0;
      ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                ((enable_shared_from_this<libtorrent::aux::torrent> *)&e);
      ::std::bind<void(libtorrent::aux::torrent::*)(),std::shared_ptr<libtorrent::aux::torrent>>
                (&local_88,(offset_in_torrent_to_subr *)&local_98,
                 (shared_ptr<libtorrent::aux::torrent> *)&e);
      ::std::function<void()>::
      function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>))()>,void>
                ((function<void()> *)&local_68,&local_88);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x48))
                ((long *)CONCAT44(extraout_var_01,iVar3),local_48.m_val,&local_68);
      ::std::function<void_()>::~function(&local_68);
      ::std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>))()>
      ::~_Bind(&local_88);
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)&e);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    else {
      paVar4 = alerts(this);
      bVar2 = alert_manager::should_post<libtorrent::cache_flushed_alert>(paVar4);
      if (bVar2) {
        paVar4 = alerts(this);
        get_handle((torrent *)local_d0);
        alert_manager::emplace_alert<libtorrent::cache_flushed_alert,libtorrent::torrent_handle>
                  (paVar4,(torrent_handle *)local_d0);
        torrent_handle::~torrent_handle((torrent_handle *)local_d0);
      }
      paVar4 = alerts(this);
      get_handle((torrent *)local_e0);
      args_1 = info_hash(this);
      cVar6 = get_userdata(this);
      _auStack_f0 = cVar6.m_type_ptr;
      alert_manager::
      emplace_alert<libtorrent::torrent_removed_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&,libtorrent::client_data_t>
                (paVar4,(torrent_handle *)local_e0,args_1,(client_data_t *)auStack_f0);
      torrent_handle::~torrent_handle((torrent_handle *)local_e0);
    }
    if ((*(uint *)&this->field_0x5d8 >> 0x19 & 1) == 0) {
      inc_stats_counter(this,0xdb,-1);
      *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfdffffff | 0x2000000;
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffff7ffffff;
    *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xfffffffe;
    update_state_list(this);
    memset(&local_f4,0,4);
    while( true ) {
      local_f8 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
                 ::end_index(&this->m_links);
      bVar2 = strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>::operator!=
                        (&local_f4,&local_f8);
      if (!bVar2) break;
      pvVar5 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
               ::operator[](&this->m_links,local_f4);
      bVar2 = link::in_list(pvVar5);
      if (bVar2) {
        pvVar5 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
                 ::operator[](&this->m_links,local_f4);
        psVar1 = (this->super_torrent_hot_members).m_ses;
        iVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x3c])
                          (psVar1,(ulong)(uint)local_f4.m_val);
        link::unlink<libtorrent::aux::torrent>
                  (pvVar5,(vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var_02,iVar3),
                   (torrent_list_index_t)local_f4.m_val);
      }
      strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>::operator++(&local_f4);
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffeffffffff;
  }
  return;
}

Assistant:

void torrent::abort()
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;

		m_abort = true;
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();
		stop_announcing();

		// remove from download queue
		m_ses.set_queue_position(this, queue_position_t{-1});

		if (m_peer_class > peer_class_t{0})
		{
			remove_class(m_ses.peer_classes(), m_peer_class);
			m_ses.peer_classes().decref(m_peer_class);
			m_peer_class = peer_class_t{0};
		}

		m_inactivity_timer.cancel();

#ifndef TORRENT_DISABLE_LOGGING
		log_to_all_peers("aborting");
#endif

		// disconnect all peers and close all
		// files belonging to the torrents
		disconnect_all(errors::torrent_aborted, operation_t::bittorrent);

		// make sure to destruct the peers immediately
		on_remove_peers();
		TORRENT_ASSERT(m_connections.empty());

		// post a message to the main thread to destruct
		// the torrent object from there
		if (m_storage)
		{
			try {
				m_ses.disk_thread().async_stop_torrent(m_storage
					, std::bind(&torrent::on_torrent_aborted, shared_from_this()));
			}
			catch (std::exception const& e)
			{
				TORRENT_UNUSED(e);
				m_storage.reset();
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("Failed to flush disk cache: %s", e.what());
#endif
				// clients may rely on this alert to be posted, so it's probably a
				// good idea to post it here, even though we failed
				// TODO: 3 should this alert have an error code in it?
				if (alerts().should_post<cache_flushed_alert>())
					alerts().emplace_alert<cache_flushed_alert>(get_handle());
			}
			m_ses.deferred_submit_jobs();
		}
		else
		{
			if (alerts().should_post<cache_flushed_alert>())
				alerts().emplace_alert<cache_flushed_alert>(get_handle());
			alerts().emplace_alert<torrent_removed_alert>(get_handle()
				, info_hash(), get_userdata());
		}

		// TODO: 2 abort lookups this torrent has made via the
		// session host resolver interface

		if (!m_apply_ip_filter)
		{
			inc_stats_counter(counters::non_filter_torrents, -1);
			m_apply_ip_filter = true;
		}

		m_paused = false;
		m_auto_managed = false;
		update_state_list();
		for (torrent_list_index_t i{}; i != m_links.end_index(); ++i)
		{
			if (!m_links[i].in_list()) continue;
			m_links[i].unlink(m_ses.torrent_list(i), i);
		}
		// don't re-add this torrent to the state-update list
		m_state_subscription = false;

#if TORRENT_USE_RTC
		if(m_rtc_signaling)
			m_rtc_signaling->close();
#endif
	}